

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CGBG_FF.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  undefined8 in_RSI;
  undefined4 in_EDI;
  E *e;
  char *p;
  
  argp_parse(ArgumentHandlers::theArgpStruc,in_EDI,in_RSI,0,0,&args);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  test_CGBG_FF();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{



    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);
    try
    {
        srand ( time(NULL) );
        test_CGBG_FF();
    }catch(E& e)
    {
        e.Print();
        return(1);
    }
    catch(char const* p)
    {
        cout << "Exception:" << p << endl;
        return(2);
    }
    return(0);
}